

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::SliceBySizeLayerParams::SerializeWithCachedSizes
          (SliceBySizeLayerParams *this,CodedOutputStream *output)

{
  if (this->size_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(2,this->size_,output);
  }
  if (this->axis_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteInt64(3,this->axis_,output);
    return;
  }
  return;
}

Assistant:

void SliceBySizeLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SliceBySizeLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // int64 size = 2;
  if (this->size() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(2, this->size(), output);
  }

  // int64 axis = 3;
  if (this->axis() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteInt64(3, this->axis(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SliceBySizeLayerParams)
}